

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O3

void __thiscall QGridLayoutPrivate::setNextPosAfter(QGridLayoutPrivate *this,int row,int col)

{
  if ((this->field_0x194 & 0x10) == 0) {
    if ((this->nextR < row) || ((this->nextR == row && (this->nextC <= col)))) {
      this->nextR = row;
      this->nextC = col + 1;
      if (this->cc <= col + 1) {
        this->nextC = 0;
        this->nextR = row + 1;
        return;
      }
    }
  }
  else if ((this->nextC < col) || ((this->nextC == col && (this->nextR <= row)))) {
    this->nextR = row + 1;
    this->nextC = col;
    if (this->rr <= row + 1) {
      this->nextR = 0;
      this->nextC = col + 1;
      return;
    }
  }
  return;
}

Assistant:

void QGridLayoutPrivate::setNextPosAfter(int row, int col)
{
    if (addVertical) {
        if (col > nextC || (col == nextC && row >= nextR)) {
            nextR = row + 1;
            nextC = col;
            if (nextR >= rr) {
                nextR = 0;
                nextC++;
            }
        }
    } else {
        if (row > nextR || (row == nextR && col >= nextC)) {
            nextR = row;
            nextC = col + 1;
            if (nextC >= cc) {
                nextC = 0;
                nextR++;
            }
        }
    }
}